

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigSplit.c
# Opt level: O2

DdManager * Aig_ManBuildPoBdd(Aig_Man_t *p,DdNode **pbFunc)

{
  DdManager *unique;
  DdNode *pDVar1;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  int i;
  ulong uVar4;
  uint i_00;
  
  if (p->nTruePos == 1) {
    Aig_ManCleanData(p);
    unique = Cudd_Init(p->nObjs[2],0,0x100,0x40000,0);
    uVar4 = 6;
    Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
    pAVar3 = p->pConst1;
    pDVar1 = Cudd_ReadOne(unique);
    (pAVar3->field_5).pData = pDVar1;
    Cudd_Ref(pDVar1);
    for (i_00 = 0; (int)i_00 < p->vCis->nSize; i_00 = i_00 + 1) {
      pvVar2 = Vec_PtrEntry(p->vCis,i_00);
      uVar4 = (ulong)i_00;
      pDVar1 = Cudd_bddIthVar(unique,i_00);
      *(DdNode **)((long)pvVar2 + 0x28) = pDVar1;
      Cudd_Ref(pDVar1);
    }
    pAVar3 = Aig_ManCo(p,(int)uVar4);
    pDVar1 = Aig_ManBuildPoBdd_rec
                       (p,(Aig_Obj_t *)((ulong)pAVar3->pFanin0 & 0xfffffffffffffffe),unique);
    *pbFunc = pDVar1;
    Cudd_Ref(pDVar1);
    *pbFunc = (DdNode *)((ulong)*pbFunc ^ (ulong)((uint)pAVar3->pFanin0 & 1));
    for (i = 0; i < p->vObjs->nSize; i = i + 1) {
      pvVar2 = Vec_PtrEntry(p->vObjs,i);
      if ((pvVar2 != (void *)0x0) && (*(DdNode **)((long)pvVar2 + 0x28) != (DdNode *)0x0)) {
        Cudd_RecursiveDeref(unique,*(DdNode **)((long)pvVar2 + 0x28));
      }
    }
    Cudd_ReduceHeap(unique,CUDD_REORDER_SYMM_SIFT,1);
    return unique;
  }
  __assert_fail("Saig_ManPoNum(p) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigSplit.c"
                ,200,"DdManager *Aig_ManBuildPoBdd(Aig_Man_t *, DdNode **)");
}

Assistant:

DdManager * Aig_ManBuildPoBdd( Aig_Man_t * p, DdNode ** pbFunc )
{
    DdManager * dd;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManPoNum(p) == 1 );
    Aig_ManCleanData( p );
    dd = Cudd_Init( Aig_ManCiNum(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    pObj = Aig_ManConst1(p);
    pObj->pData = Cudd_ReadOne(dd);  Cudd_Ref( (DdNode *)pObj->pData );
    Aig_ManForEachCi( p, pObj, i )
    {
        pObj->pData = Cudd_bddIthVar(dd, i);  Cudd_Ref( (DdNode *)pObj->pData );
    }
    pObj = Aig_ManCo( p, 0 );
    *pbFunc = Aig_ManBuildPoBdd_rec( p, Aig_ObjFanin0(pObj), dd );  Cudd_Ref( *pbFunc );
    *pbFunc = Cudd_NotCond( *pbFunc, Aig_ObjFaninC0(pObj) );
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( pObj->pData )
            Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
    }
    Cudd_ReduceHeap( dd,  CUDD_REORDER_SYMM_SIFT, 1 );
    return dd;
}